

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_shared_reference.cpp
# Opt level: O2

void lower_shared_reference(gl_context *ctx,gl_shader_program *prog,gl_linked_shader *shader)

{
  lower_shared_reference_visitor v;
  
  if (shader->Stage == MESA_SHADER_COMPUTE) {
    lower_buffer_access::lower_buffer_access::lower_buffer_access(&v.super_lower_buffer_access);
    v.super_lower_buffer_access.super_ir_rvalue_enter_visitor.super_ir_rvalue_base_visitor.
    super_ir_hierarchical_visitor._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_00250f30;
    v.list_ctx = ralloc_context((void *)0x0);
    v.shared_size = 0;
    v.var_offsets.prev = &v.var_offsets;
    v.shader = shader;
    v.var_offsets.next = v.var_offsets.prev;
    do {
      v.progress = false;
      visit_list_elements((ir_hierarchical_visitor *)&v,shader->ir,true);
    } while (v.progress != false);
    (prog->Comp).SharedSize = v.shared_size;
    if ((ctx->Const).MaxComputeSharedMemorySize < v.shared_size) {
      linker_error(prog,"Too much shared memory used (%u/%u)\n");
    }
    anon_unknown.dwarf_6a8c5::lower_shared_reference_visitor::~lower_shared_reference_visitor(&v);
  }
  return;
}

Assistant:

void
lower_shared_reference(struct gl_context *ctx,
                       struct gl_shader_program *prog,
                       struct gl_linked_shader *shader)
{
   if (shader->Stage != MESA_SHADER_COMPUTE)
      return;

   lower_shared_reference_visitor v(shader);

   /* Loop over the instructions lowering references, because we take a deref
    * of an shared variable array using a shared variable dereference as the
    * index will produce a collection of instructions all of which have cloned
    * shared variable dereferences for that array index.
    */
   do {
      v.progress = false;
      visit_list_elements(&v, shader->ir);
   } while (v.progress);

   prog->Comp.SharedSize = v.shared_size;

   /* Section 19.1 (Compute Shader Variables) of the OpenGL 4.5 (Core Profile)
    * specification says:
    *
    *   "There is a limit to the total size of all variables declared as
    *    shared in a single program object. This limit, expressed in units of
    *    basic machine units, may be queried as the value of
    *    MAX_COMPUTE_SHARED_MEMORY_SIZE."
    */
   if (prog->Comp.SharedSize > ctx->Const.MaxComputeSharedMemorySize) {
      linker_error(prog, "Too much shared memory used (%u/%u)\n",
                   prog->Comp.SharedSize,
                   ctx->Const.MaxComputeSharedMemorySize);
   }
}